

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update7_ghosts(Integer g_a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  C_Integer *pCVar6;
  ushort uVar7;
  Integer proc;
  logical lVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  Integer IVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int _d;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  C_Integer CVar20;
  long lVar21;
  ushort uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  char *pcVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong proc_00;
  long lVar32;
  long lVar33;
  bool bVar34;
  ulong *local_558;
  Integer *local_550;
  int _index [7];
  Integer _hi [7];
  Integer np;
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar8 = pnga_has_ghosts(g_a);
  if (lVar8 != 0) {
    lVar1 = g_a + 1000;
    iVar2 = GA[lVar1].elemsize;
    lVar16 = (long)GA[lVar1].ndim;
    iVar3 = GA[lVar1].p_handle;
    lVar9 = 0;
    lVar21 = 0;
    if (0 < lVar16) {
      lVar21 = lVar16;
    }
    for (; lVar21 != lVar9; lVar9 = lVar9 + 1) {
      width[lVar9] = GA[g_a + 1000].width[lVar9];
      dims[lVar9] = GA[g_a + 1000].dims[lVar9];
    }
    lVar8 = gai_check_ghost_distr(g_a);
    if (lVar8 == 0) {
      return 0;
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar9 = 1;
    lVar10 = lVar21;
    while (bVar34 = lVar10 != 0, lVar10 = lVar10 + -1, bVar34) {
      lVar9 = lVar9 * 3;
    }
    lVar16 = lVar16 + -1;
    lVar10 = lVar16;
    if (lVar16 < 1) {
      lVar10 = 0;
    }
    local_558 = (ulong *)0x0;
    local_550 = (Integer *)0x0;
    lVar31 = 0;
    while( true ) {
      lVar25 = 0;
      if (lVar31 == lVar9) break;
      lVar33 = lVar31;
      lVar15 = 1;
      for (lVar24 = 0; lVar21 != lVar24; lVar24 = lVar24 + 1) {
        lVar17 = lVar33 % 3 + -1;
        mask[lVar24] = lVar17;
        if (lVar17 != 0) {
          lVar15 = lVar25;
        }
        lVar33 = lVar33 / 3;
      }
      if (lVar15 == 0) {
        lVar33 = 0;
        for (lVar15 = 0; lVar21 != lVar15; lVar15 = lVar15 + 1) {
          if ((mask[lVar15] != 0) && (width[lVar15] == 0)) {
            lVar33 = 1;
          }
        }
        if (lVar33 == 0) {
          for (lVar33 = 0; IVar12 = GAnproc, lVar21 != lVar33; lVar33 = lVar33 + 1) {
            lVar15 = mask[lVar33];
            if (lVar15 == -1) {
              lVar15 = lo_loc[lVar33];
              if (1 < lVar15) {
                tlo_rem[lVar33] = lVar15 - width[lVar33];
                lVar15 = lVar15 + -1;
                goto LAB_0019361d;
              }
              thi_rem[lVar33] = dims[lVar33];
              tlo_rem[lVar33] = (dims[lVar33] - width[lVar33]) + 1;
            }
            else {
              if (lVar15 == 1) {
                lVar15 = hi_loc[lVar33];
                if (lVar15 < dims[lVar33]) {
                  tlo_rem[lVar33] = lVar15 + 1;
                  lVar15 = lVar15 + width[lVar33];
                }
                else {
                  tlo_rem[lVar33] = 1;
                  lVar15 = width[lVar33];
                }
              }
              else {
                if (lVar15 != 0) {
                  fwrite("Illegal mask value found\n",0x19,1,_stderr);
                  goto LAB_00193625;
                }
                tlo_rem[lVar33] = lo_loc[lVar33];
                lVar15 = hi_loc[lVar33];
              }
LAB_0019361d:
              thi_rem[lVar33] = lVar15;
            }
LAB_00193625:
          }
          local_550 = (Integer *)malloc(GAnproc * 0x70 | 8);
          if (local_550 == (Integer *)0x0) {
            pnga_error("pnga_update7_ghosts:malloc failed (_ga_map)",0);
            IVar12 = GAnproc;
          }
          local_558 = (ulong *)malloc(IVar12 << 3);
          if (local_558 == (ulong *)0x0) {
            pnga_error("pnga_update7_ghosts:malloc failed (_ga_proclist)",0);
          }
          lVar8 = pnga_locate_region(g_a,tlo_rem,thi_rem,local_550,(Integer *)local_558,&np);
          if (lVar8 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar1].name);
            sVar11 = strlen(err_string);
            sprintf(err_string + (int)sVar11," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
            sVar11 = strlen(err_string);
            lVar33 = 1;
            while( true ) {
              IVar12 = pnga_ndim(g_a);
              pcVar26 = err_string + (int)sVar11;
              if (IVar12 <= lVar33) break;
              sprintf(pcVar26,",%ld:%ld ",tlo_rem[lVar33],thi_rem[lVar33]);
              sVar11 = strlen(err_string);
              lVar33 = lVar33 + 1;
            }
            pcVar26[0] = ']';
            pcVar26[1] = '\0';
            pnga_error(err_string,g_a);
          }
          if (1 < np) {
            fwrite("More than one remote processor found\n",0x25,1,_stderr);
          }
          proc_00 = *local_558;
          pnga_distribution(g_a,proc_00,tlo_rem,thi_rem);
          for (lVar33 = 0; lVar21 != lVar33; lVar33 = lVar33 + 1) {
            lVar15 = mask[lVar33];
            if (lVar15 == -1) {
              plo_loc[lVar33] = 0;
              phi_loc[lVar33] = width[lVar33] + -1;
              lVar15 = (thi_rem[lVar33] - tlo_rem[lVar33]) + 1;
LAB_001938bd:
              plo_rem[lVar33] = lVar15;
            }
            else {
              if (lVar15 == 1) {
                lVar15 = width[lVar33];
                plo_loc[lVar33] = lVar15 + (hi_loc[lVar33] - lo_loc[lVar33]) + 1;
                lVar24 = (hi_loc[lVar33] - lo_loc[lVar33]) + lVar15 * 2;
LAB_00193884:
                phi_loc[lVar33] = lVar24;
                goto LAB_001938bd;
              }
              if (lVar15 == 0) {
                lVar15 = width[lVar33];
                plo_loc[lVar33] = lVar15;
                lVar24 = (hi_loc[lVar33] + lVar15) - lo_loc[lVar33];
                goto LAB_00193884;
              }
            }
          }
          uVar22 = GA[lVar1].ndim;
          lVar33 = (long)(short)uVar22;
          iVar29 = GA[lVar1].distr_type;
          if (iVar29 - 1U < 3) {
            lVar24 = (long)(int)proc % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar24;
            IVar12 = proc;
            lVar15 = 0;
            while (lVar15 + 1 < lVar33) {
              IVar12 = (long)((int)IVar12 - (int)lVar24) / GA[g_a + 1000].num_blocks[lVar15];
              lVar24 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar15 + 1];
              _index[lVar15 + 1] = (int)lVar24;
              lVar15 = lVar15 + 1;
            }
            uVar7 = 0;
            if (0 < (short)uVar22) {
              uVar7 = uVar22;
            }
            for (lVar15 = 0; (ulong)uVar7 * 4 != lVar15; lVar15 = lVar15 + 4) {
              iVar28 = *(int *)((long)_index + lVar15);
              lVar24 = *(long *)((long)GA[g_a + 1000].block_dims + lVar15 * 2);
              *(long *)(err_string + lVar15 * 2) = lVar24 * iVar28 + 1;
              lVar24 = ((long)iVar28 + 1) * lVar24;
              lVar17 = *(long *)((long)GA[g_a + 1000].dims + lVar15 * 2);
              if (lVar17 <= lVar24) {
                lVar24 = lVar17;
              }
              *(long *)((long)_hi + lVar15 * 2) = lVar24;
            }
          }
          else if (iVar29 == 4) {
            lVar24 = (long)(int)proc % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar24;
            IVar12 = proc;
            lVar15 = 0;
            while (lVar15 + 1 < lVar33) {
              IVar12 = (long)((int)IVar12 - (int)lVar24) / GA[g_a + 1000].num_blocks[lVar15];
              lVar24 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar15 + 1];
              _index[lVar15 + 1] = (int)lVar24;
              lVar15 = lVar15 + 1;
            }
            lVar15 = 0;
            uVar7 = 0;
            if (0 < (short)uVar22) {
              uVar7 = uVar22;
            }
            iVar28 = 0;
            for (; (ulong)uVar7 * 4 != lVar15; lVar15 = lVar15 + 4) {
              pCVar6 = GA[lVar1].mapc;
              iVar23 = *(int *)((long)_index + lVar15);
              lVar17 = (long)iVar28 + (long)iVar23;
              *(C_Integer *)(err_string + lVar15 * 2) = pCVar6[lVar17];
              lVar24 = *(long *)((long)GA[lVar1].num_blocks + lVar15 * 2);
              if ((long)iVar23 < lVar24 + -1) {
                lVar17 = pCVar6[lVar17 + 1] + -1;
              }
              else {
                lVar17 = *(long *)((long)GA[lVar1].dims + lVar15 * 2);
              }
              *(long *)((long)_hi + lVar15 * 2) = lVar17;
              iVar28 = iVar28 + (int)lVar24;
            }
          }
          else if (iVar29 == 0) {
            if (GA[lVar1].num_rstrctd == 0) {
              lVar15 = 0;
              if (0 < lVar33) {
                lVar15 = lVar33;
              }
              lVar24 = 1;
              for (lVar17 = 0; lVar15 != lVar17; lVar17 = lVar17 + 1) {
                lVar24 = lVar24 * GA[g_a + 1000].nblock[lVar17];
              }
              if ((proc < 0) || (lVar24 <= proc)) {
                for (lVar24 = 0; lVar15 != lVar24; lVar24 = lVar24 + 1) {
                  hi_loc[lVar24 + -0x20] = 0;
                  _hi[lVar24] = -1;
                }
              }
              else {
                lVar17 = 0;
                IVar12 = proc;
                for (lVar24 = 0; lVar15 != lVar24; lVar24 = lVar24 + 1) {
                  lVar18 = (long)GA[g_a + 1000].nblock[lVar24];
                  lVar13 = IVar12 % lVar18;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar24 + -0x20] = pCVar6[lVar13 + lVar17];
                  if (lVar13 == lVar18 + -1) {
                    CVar20 = GA[g_a + 1000].dims[lVar24];
                  }
                  else {
                    CVar20 = pCVar6[lVar13 + lVar17 + 1] + -1;
                  }
                  lVar17 = lVar17 + lVar18;
                  _hi[lVar24] = CVar20;
                  IVar12 = IVar12 / lVar18;
                }
              }
            }
            else if (proc < GA[lVar1].num_rstrctd) {
              lVar15 = 0;
              if (0 < lVar33) {
                lVar15 = lVar33;
              }
              lVar24 = 1;
              for (lVar17 = 0; lVar15 != lVar17; lVar17 = lVar17 + 1) {
                lVar24 = lVar24 * GA[g_a + 1000].nblock[lVar17];
              }
              if ((proc < 0) || (lVar24 <= proc)) {
                for (lVar24 = 0; lVar15 != lVar24; lVar24 = lVar24 + 1) {
                  hi_loc[lVar24 + -0x20] = 0;
                  _hi[lVar24] = -1;
                }
              }
              else {
                lVar24 = 0;
                IVar12 = proc;
                for (lVar17 = 0; lVar15 != lVar17; lVar17 = lVar17 + 1) {
                  lVar18 = (long)GA[g_a + 1000].nblock[lVar17];
                  lVar13 = IVar12 % lVar18;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar17 + -0x20] = pCVar6[lVar13 + lVar24];
                  if (lVar13 == lVar18 + -1) {
                    CVar20 = GA[g_a + 1000].dims[lVar17];
                  }
                  else {
                    CVar20 = pCVar6[lVar13 + lVar24 + 1] + -1;
                  }
                  lVar24 = lVar24 + lVar18;
                  _hi[lVar17] = CVar20;
                  IVar12 = IVar12 / lVar18;
                }
              }
            }
            else {
              iVar28 = 0;
              if (0 < (short)uVar22) {
                iVar28 = (int)(short)uVar22;
              }
              for (lVar15 = 0; iVar28 != lVar15; lVar15 = lVar15 + 1) {
                hi_loc[lVar15 + -0x20] = 0;
                _hi[lVar15] = -1;
              }
            }
          }
          lVar15 = lVar33 + -1;
          if (lVar15 == 0) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
          }
          lVar24 = 0;
          if (0 < lVar15) {
            lVar24 = lVar15;
          }
          lVar13 = 0;
          lVar17 = 1;
          for (lVar18 = 0; lVar24 != lVar18; lVar18 = lVar18 + 1) {
            lVar13 = lVar13 + plo_loc[lVar18] * lVar17;
            lVar30 = (_hi[lVar18] - hi_loc[lVar18 + -0x20]) + GA[g_a + 1000].width[lVar18] * 2 + 1;
            ld_loc[lVar18] = lVar30;
            lVar17 = lVar17 * lVar30;
          }
          lVar18 = *(long *)(stride_loc + lVar33 * 2 + 6);
          ppcVar4 = GA[lVar1].ptr;
          iVar28 = GA[lVar1].elemsize;
          pcVar26 = ppcVar4[proc];
          if (iVar29 - 1U < 3) {
            lVar30 = (long)(int)proc_00 % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar30;
            uVar14 = proc_00;
            lVar25 = 0;
            while (lVar25 + 1 < lVar33) {
              uVar14 = (long)((int)uVar14 - (int)lVar30) / GA[g_a + 1000].num_blocks[lVar25];
              lVar30 = (long)(int)uVar14 % GA[g_a + 1000].num_blocks[lVar25 + 1];
              _index[lVar25 + 1] = (int)lVar30;
              lVar25 = lVar25 + 1;
            }
            uVar7 = 0;
            if (0 < (short)uVar22) {
              uVar7 = uVar22;
            }
            for (lVar25 = 0; (ulong)uVar7 * 4 != lVar25; lVar25 = lVar25 + 4) {
              iVar29 = *(int *)((long)_index + lVar25);
              lVar30 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
              *(long *)(err_string + lVar25 * 2) = lVar30 * iVar29 + 1;
              lVar30 = ((long)iVar29 + 1) * lVar30;
              lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
              if (lVar27 <= lVar30) {
                lVar30 = lVar27;
              }
              *(long *)((long)_hi + lVar25 * 2) = lVar30;
            }
          }
          else if (iVar29 == 4) {
            lVar30 = (long)(int)proc_00 % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar30;
            uVar14 = proc_00;
            lVar25 = 0;
            while (lVar25 + 1 < lVar33) {
              uVar14 = (long)((int)uVar14 - (int)lVar30) / GA[g_a + 1000].num_blocks[lVar25];
              lVar30 = (long)(int)uVar14 % GA[g_a + 1000].num_blocks[lVar25 + 1];
              _index[lVar25 + 1] = (int)lVar30;
              lVar25 = lVar25 + 1;
            }
            lVar25 = 0;
            if ((short)uVar22 < 1) {
              uVar22 = 0;
            }
            iVar29 = 0;
            for (; (ulong)uVar22 * 4 != lVar25; lVar25 = lVar25 + 4) {
              pCVar6 = GA[lVar1].mapc;
              iVar23 = *(int *)((long)_index + lVar25);
              lVar27 = (long)iVar29 + (long)iVar23;
              *(C_Integer *)(err_string + lVar25 * 2) = pCVar6[lVar27];
              lVar30 = *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2);
              if ((long)iVar23 < lVar30 + -1) {
                lVar27 = pCVar6[lVar27 + 1] + -1;
              }
              else {
                lVar27 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
              }
              *(long *)((long)_hi + lVar25 * 2) = lVar27;
              iVar29 = iVar29 + (int)lVar30;
            }
          }
          else if (iVar29 == 0) {
            if (GA[lVar1].num_rstrctd == 0) {
              lVar30 = lVar33;
              if (lVar33 < 1) {
                lVar30 = lVar25;
              }
              lVar25 = 1;
              for (lVar27 = 0; lVar30 != lVar27; lVar27 = lVar27 + 1) {
                lVar25 = lVar25 * GA[g_a + 1000].nblock[lVar27];
              }
              if (((long)proc_00 < 0) || (lVar25 <= (long)proc_00)) {
                for (lVar25 = 0; lVar30 != lVar25; lVar25 = lVar25 + 1) {
                  hi_loc[lVar25 + -0x20] = 0;
                  _hi[lVar25] = -1;
                }
              }
              else {
                lVar27 = 0;
                uVar14 = proc_00;
                for (lVar25 = 0; lVar30 != lVar25; lVar25 = lVar25 + 1) {
                  lVar32 = (long)GA[g_a + 1000].nblock[lVar25];
                  lVar19 = (long)uVar14 % lVar32;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar25 + -0x20] = pCVar6[lVar19 + lVar27];
                  if (lVar19 == lVar32 + -1) {
                    CVar20 = GA[g_a + 1000].dims[lVar25];
                  }
                  else {
                    CVar20 = pCVar6[lVar19 + lVar27 + 1] + -1;
                  }
                  lVar27 = lVar27 + lVar32;
                  _hi[lVar25] = CVar20;
                  uVar14 = (long)uVar14 / lVar32;
                }
              }
            }
            else if ((long)proc_00 < GA[lVar1].num_rstrctd) {
              lVar30 = lVar33;
              if (lVar33 < 1) {
                lVar30 = lVar25;
              }
              lVar25 = 1;
              for (lVar27 = 0; lVar30 != lVar27; lVar27 = lVar27 + 1) {
                lVar25 = lVar25 * GA[g_a + 1000].nblock[lVar27];
              }
              if (((long)proc_00 < 0) || (lVar25 <= (long)proc_00)) {
                for (lVar25 = 0; lVar30 != lVar25; lVar25 = lVar25 + 1) {
                  hi_loc[lVar25 + -0x20] = 0;
                  _hi[lVar25] = -1;
                }
              }
              else {
                lVar27 = 0;
                uVar14 = proc_00;
                for (lVar25 = 0; lVar30 != lVar25; lVar25 = lVar25 + 1) {
                  lVar32 = (long)GA[g_a + 1000].nblock[lVar25];
                  lVar19 = (long)uVar14 % lVar32;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar25 + -0x20] = pCVar6[lVar19 + lVar27];
                  if (lVar19 == lVar32 + -1) {
                    CVar20 = GA[g_a + 1000].dims[lVar25];
                  }
                  else {
                    CVar20 = pCVar6[lVar19 + lVar27 + 1] + -1;
                  }
                  lVar27 = lVar27 + lVar32;
                  _hi[lVar25] = CVar20;
                  uVar14 = (long)uVar14 / lVar32;
                }
              }
            }
            else {
              iVar29 = 0;
              if (0 < (short)uVar22) {
                iVar29 = (int)(short)uVar22;
              }
              for (lVar25 = 0; iVar29 != lVar25; lVar25 = lVar25 + 1) {
                hi_loc[lVar25 + -0x20] = 0;
                _hi[lVar25] = -1;
              }
            }
          }
          if (lVar15 == 0) {
            ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
          }
          lVar25 = 1;
          lVar15 = 0;
          for (lVar30 = 0; lVar24 != lVar30; lVar30 = lVar30 + 1) {
            lVar15 = lVar15 + plo_rem[lVar30] * lVar25;
            lVar27 = (_hi[lVar30] - hi_loc[lVar30 + -0x20]) + GA[g_a + 1000].width[lVar30] * 2 + 1;
            ld_rem[lVar30] = lVar27;
            lVar25 = lVar25 * lVar27;
          }
          lVar33 = plo_rem[lVar33 + -1];
          pcVar5 = ppcVar4[proc_00];
          stride_loc[0] = iVar2;
          stride_rem[0] = iVar2;
          iVar29 = iVar2;
          iVar23 = iVar2;
          for (lVar24 = 0; lVar10 << 2 != lVar24; lVar24 = lVar24 + 4) {
            iVar29 = iVar29 * *(int *)((long)ld_rem + lVar24 * 2);
            *(int *)((long)stride_rem + lVar24) = iVar29;
            iVar23 = iVar23 * *(int *)((long)ld_loc + lVar24 * 2);
            *(int *)((long)stride_loc + lVar24) = iVar23;
            *(int *)((long)stride_rem + lVar24 + 4) = iVar29;
            *(int *)((long)stride_loc + lVar24 + 4) = iVar23;
          }
          for (lVar24 = 0; lVar21 != lVar24; lVar24 = lVar24 + 1) {
            count[lVar24] = ((int)phi_loc[lVar24] - (int)plo_loc[lVar24]) + 1;
          }
          count[0] = count[0] * iVar2;
          if (-1 < iVar3) {
            proc_00 = (ulong)(uint)PGRP_LIST[iVar3].inv_map_proc_list[proc_00];
          }
          ARMCI_NbGetS(pcVar5 + (lVar25 * lVar33 + lVar15) * (long)iVar28,stride_rem,
                       pcVar26 + (lVar17 * lVar18 + lVar13) * (long)iVar28,stride_loc,count,
                       (int)lVar16,(int)proc_00,(armci_hdl_t *)0x0);
        }
      }
      lVar31 = lVar31 + 1;
    }
    ARMCI_WaitAll();
    free(local_550);
    free(local_558);
  }
  return 1;
}

Assistant:

logical pnga_update7_ghosts(Integer g_a)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return TRUE;
  }

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of GET operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all GET operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    /*if (itmp>1) mask0 = TRUE; */
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor from which it is coming. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }

    _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
    if(!_ga_map) pnga_error("pnga_update7_ghosts:malloc failed (_ga_map)",0);
    _ga_proclist = malloc(GAnproc*sizeof(Integer));
    if(!_ga_proclist) pnga_error("pnga_update7_ghosts:malloc failed (_ga_proclist)",0);

    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to send
       data to it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;

    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    /* put data on remote processor */
/*    ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem); */
    ARMCI_NbGetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem, NULL);
  }

  ARMCI_WaitAll();
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}